

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall
FIX::double_conversion::Bignum::AssignHexString(Bignum *this,Vector<const_char> value)

{
  int iVar1;
  uint uVar2;
  char *__function;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Chunk current_bigit;
  uint uVar7;
  ulong local_48;
  
  uVar2 = value.length_;
  Zero(this);
  if (0x37f < (int)uVar2) {
    abort();
  }
  uVar5 = uVar2 - 1;
  if (6 < (int)uVar2) {
    local_48 = 0;
    uVar6 = (ulong)uVar5;
    do {
      iVar4 = 0;
      uVar7 = 0;
      uVar3 = uVar6;
      do {
        if (((int)uVar3 < 0) || ((int)uVar2 <= (int)uVar6)) goto LAB_00165dc9;
        uVar5 = (int)uVar3 - 1;
        iVar1 = HexCharValue(value.start_[uVar3]);
        uVar7 = uVar7 + (iVar1 << ((byte)iVar4 & 0x1f));
        iVar4 = iVar4 + 4;
        uVar3 = (ulong)uVar5;
      } while (iVar4 != 0x1c);
      if ((long)(this->bigits_).length_ <= (long)local_48) goto LAB_00165de8;
      (this->bigits_).start_[local_48] = uVar7;
      local_48 = local_48 + 1;
      uVar6 = (ulong)uVar5;
    } while (local_48 != (uint)((int)uVar2 / 7));
  }
  this->used_digits_ = (int)uVar2 / 7;
  if ((int)uVar5 < 0) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar3;
    }
    uVar2 = 0;
    do {
      if (uVar6 == uVar3) goto LAB_00165dc9;
      uVar7 = HexCharValue(value.start_[uVar3]);
      uVar2 = uVar7 | uVar2 << 4;
      uVar3 = uVar3 + 1;
    } while (uVar5 + 1 != uVar3);
  }
  if (uVar2 != 0) {
    iVar4 = this->used_digits_;
    if (((long)iVar4 < 0) || ((this->bigits_).length_ <= iVar4)) {
LAB_00165de8:
      __function = 
      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]";
      goto LAB_00165dde;
    }
    (this->bigits_).start_[iVar4] = uVar2;
    this->used_digits_ = this->used_digits_ + 1;
  }
  Clamp(this);
  return;
LAB_00165dc9:
  __function = 
  "T &FIX::double_conversion::Vector<const char>::operator[](int) const [T = const char]";
LAB_00165dde:
  __assert_fail("0 <= index && index < length_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xca,__function);
}

Assistant:

void Bignum::AssignHexString(Vector<const char> value) {
  Zero();
  int length = value.length();

  int needed_bigits = length * 4 / kBigitSize + 1;
  EnsureCapacity(needed_bigits);
  int string_index = length - 1;
  for (int i = 0; i < needed_bigits - 1; ++i) {
    // These bigits are guaranteed to be "full".
    Chunk current_bigit = 0;
    for (int j = 0; j < kBigitSize / 4; j++) {
      current_bigit += HexCharValue(value[string_index--]) << (j * 4);
    }
    bigits_[i] = current_bigit;
  }
  used_digits_ = needed_bigits - 1;

  Chunk most_significant_bigit = 0;  // Could be = 0;
  for (int j = 0; j <= string_index; ++j) {
    most_significant_bigit <<= 4;
    most_significant_bigit += HexCharValue(value[j]);
  }
  if (most_significant_bigit != 0) {
    bigits_[used_digits_] = most_significant_bigit;
    used_digits_++;
  }
  Clamp();
}